

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O3

void Assimp::SceneCombiner::MergeMeshes
               (aiMesh **_out,uint param_2,const_iterator begin,const_iterator end)

{
  aiFace *paVar1;
  char *__src;
  ai_uint32 aVar2;
  aiMesh *paVar3;
  size_t sVar4;
  aiVector3D *paVar5;
  aiMesh *paVar6;
  aiVector3D *__s;
  aiColor4D *__s_00;
  Logger *pLVar7;
  ulong *puVar8;
  aiFace *paVar9;
  int iVar10;
  aiFace *paVar11;
  const_iterator cVar12;
  uint uVar13;
  ulong uVar14;
  const_iterator it_6;
  ulong uVar15;
  const_iterator it;
  const_iterator it_2;
  long lVar16;
  string name;
  allocator local_81;
  char *local_80;
  undefined8 local_78;
  char local_70 [16];
  aiVector3D **local_60;
  aiColor4D **local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (_out != (aiMesh **)0x0) {
    if (begin._M_current == end._M_current) {
      *_out = (aiMesh *)0x0;
    }
    else {
      paVar3 = (aiMesh *)operator_new(0x520);
      paVar3->mPrimitiveTypes = 0;
      paVar3->mNumVertices = 0;
      paVar3->mNumFaces = 0;
      local_60 = &paVar3->mVertices;
      memset(local_60,0,0xcc);
      paVar3->mBones = (aiBone **)0x0;
      paVar3->mMaterialIndex = 0;
      (paVar3->mName).length = 0;
      (paVar3->mName).data[0] = '\0';
      memset((paVar3->mName).data + 1,0x1b,0x3ff);
      paVar3->mNumAnimMeshes = 0;
      paVar3->mAnimMeshes = (aiAnimMesh **)0x0;
      paVar3->mMethod = 0;
      (paVar3->mAABB).mMin.x = 0.0;
      (paVar3->mAABB).mMin.y = 0.0;
      (paVar3->mAABB).mMin.z = 0.0;
      (paVar3->mAABB).mMax.x = 0.0;
      (paVar3->mAABB).mMax.y = 0.0;
      (paVar3->mAABB).mMax.z = 0.0;
      local_58 = paVar3->mColors;
      memset(local_58,0,0xa0);
      *_out = paVar3;
      paVar3->mMaterialIndex = (*begin._M_current)->mMaterialIndex;
      local_80 = local_70;
      local_78 = 0;
      local_70[0] = '\0';
      cVar12._M_current = begin._M_current;
      do {
        std::__cxx11::string::string
                  ((string *)local_50,((*cVar12._M_current)->mName).data,&local_81);
        std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_50[0]);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        if (cVar12._M_current != end._M_current + -1) {
          std::__cxx11::string::append((char *)&local_80);
        }
        __src = local_80;
        paVar6 = *cVar12._M_current;
        uVar13 = paVar3->mNumVertices + paVar6->mNumVertices;
        paVar3->mNumVertices = uVar13;
        paVar3->mNumFaces = paVar3->mNumFaces + paVar6->mNumFaces;
        paVar3->mNumBones = paVar3->mNumBones + paVar6->mNumBones;
        paVar3->mPrimitiveTypes = paVar3->mPrimitiveTypes | paVar6->mPrimitiveTypes;
        cVar12._M_current = cVar12._M_current + 1;
      } while (cVar12._M_current != end._M_current);
      sVar4 = strlen(local_80);
      aVar2 = (ai_uint32)sVar4;
      if ((int)aVar2 < 0x400) {
        (paVar3->mName).length = aVar2;
        memcpy((paVar3->mName).data,__src,(long)(int)aVar2);
        (paVar3->mName).data[(int)aVar2] = '\0';
        uVar13 = paVar3->mNumVertices;
      }
      if (uVar13 != 0) {
        paVar6 = *begin._M_current;
        if ((paVar6->mVertices != (aiVector3D *)0x0) && (paVar6->mNumVertices != 0)) {
          paVar5 = (aiVector3D *)operator_new__((ulong)uVar13 * 0xc);
          memset(paVar5,0,(((ulong)uVar13 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          *local_60 = paVar5;
          cVar12._M_current = begin._M_current;
          do {
            paVar6 = *cVar12._M_current;
            if (paVar6->mVertices == (aiVector3D *)0x0) {
              pLVar7 = DefaultLogger::get();
              Logger::warn(pLVar7,
                           "JoinMeshes: Positions expected but input mesh contains no positions");
              paVar6 = *cVar12._M_current;
            }
            else {
              memcpy(paVar5,paVar6->mVertices,(ulong)paVar6->mNumVertices * 0xc);
            }
            paVar5 = paVar5 + paVar6->mNumVertices;
            cVar12._M_current = cVar12._M_current + 1;
          } while (cVar12._M_current != end._M_current);
          paVar6 = *begin._M_current;
        }
        if ((paVar6->mNormals != (aiVector3D *)0x0) && (paVar6->mNumVertices != 0)) {
          uVar13 = paVar3->mNumVertices;
          uVar15 = (ulong)uVar13 * 0xc;
          paVar5 = (aiVector3D *)operator_new__(uVar15);
          if (uVar13 != 0) {
            memset(paVar5,0,((uVar15 - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar3->mNormals = paVar5;
          cVar12._M_current = begin._M_current;
          do {
            paVar6 = *cVar12._M_current;
            if (paVar6->mNormals == (aiVector3D *)0x0) {
              pLVar7 = DefaultLogger::get();
              Logger::warn(pLVar7,"JoinMeshes: Normals expected but input mesh contains no normals")
              ;
              paVar6 = *cVar12._M_current;
            }
            else {
              memcpy(paVar5,paVar6->mNormals,(ulong)paVar6->mNumVertices * 0xc);
            }
            paVar5 = paVar5 + paVar6->mNumVertices;
            cVar12._M_current = cVar12._M_current + 1;
          } while (cVar12._M_current != end._M_current);
          paVar6 = *begin._M_current;
        }
        if (((paVar6->mTangents != (aiVector3D *)0x0) && (paVar6->mBitangents != (aiVector3D *)0x0))
           && (paVar6->mNumVertices != 0)) {
          uVar13 = paVar3->mNumVertices;
          uVar15 = (ulong)uVar13 * 0xc;
          paVar5 = (aiVector3D *)operator_new__(uVar15);
          if (uVar13 != 0) {
            memset(paVar5,0,((uVar15 - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar3->mTangents = paVar5;
          __s = (aiVector3D *)operator_new__(uVar15);
          if (uVar13 != 0) {
            memset(__s,0,((uVar15 - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar3->mBitangents = __s;
          cVar12._M_current = begin._M_current;
          do {
            paVar6 = *cVar12._M_current;
            if (paVar6->mTangents == (aiVector3D *)0x0) {
              pLVar7 = DefaultLogger::get();
              Logger::warn(pLVar7,
                           "JoinMeshes: Tangents expected but input mesh contains no tangents");
              paVar6 = *cVar12._M_current;
            }
            else {
              memcpy(paVar5,paVar6->mTangents,(ulong)paVar6->mNumVertices * 0xc);
              memcpy(__s,paVar6->mBitangents,(ulong)paVar6->mNumVertices * 0xc);
            }
            paVar5 = paVar5 + paVar6->mNumVertices;
            __s = __s + paVar6->mNumVertices;
            cVar12._M_current = cVar12._M_current + 1;
          } while (cVar12._M_current != end._M_current);
        }
        lVar16 = 0;
        do {
          paVar6 = *begin._M_current;
          if ((paVar6->mTextureCoords[lVar16] == (aiVector3D *)0x0) || (paVar6->mNumVertices == 0))
          break;
          paVar3->mNumUVComponents[lVar16] = paVar6->mNumUVComponents[lVar16];
          uVar13 = paVar3->mNumVertices;
          uVar15 = (ulong)uVar13 * 0xc;
          paVar5 = (aiVector3D *)operator_new__(uVar15);
          if (uVar13 != 0) {
            memset(paVar5,0,((uVar15 - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar3->mTextureCoords[lVar16] = paVar5;
          cVar12._M_current = begin._M_current;
          do {
            paVar6 = *cVar12._M_current;
            if (paVar6->mTextureCoords[lVar16] == (aiVector3D *)0x0) {
              pLVar7 = DefaultLogger::get();
              Logger::warn(pLVar7,"JoinMeshes: UVs expected but input mesh contains no UVs");
              paVar6 = *cVar12._M_current;
            }
            else {
              memcpy(paVar5,paVar6->mTextureCoords[lVar16],(ulong)paVar6->mNumVertices * 0xc);
            }
            paVar5 = paVar5 + paVar6->mNumVertices;
            cVar12._M_current = cVar12._M_current + 1;
          } while (cVar12._M_current != end._M_current);
          lVar16 = lVar16 + 1;
        } while (lVar16 != 8);
        lVar16 = 0;
        do {
          if (((*begin._M_current)->mColors[lVar16] == (aiColor4D *)0x0) ||
             ((*begin._M_current)->mNumVertices == 0)) break;
          uVar13 = paVar3->mNumVertices;
          uVar15 = (ulong)uVar13 << 4;
          __s_00 = (aiColor4D *)operator_new__(uVar15);
          if (uVar13 != 0) {
            memset(__s_00,0,uVar15);
          }
          local_58[lVar16] = __s_00;
          cVar12._M_current = begin._M_current;
          do {
            paVar6 = *cVar12._M_current;
            if (paVar6->mColors[lVar16] == (aiColor4D *)0x0) {
              pLVar7 = DefaultLogger::get();
              Logger::warn(pLVar7,"JoinMeshes: VCs expected but input mesh contains no VCs");
              paVar6 = *cVar12._M_current;
            }
            else {
              memcpy(__s_00,paVar6->mColors[lVar16],(ulong)paVar6->mNumVertices << 4);
            }
            __s_00 = __s_00 + paVar6->mNumVertices;
            cVar12._M_current = cVar12._M_current + 1;
          } while (cVar12._M_current != end._M_current);
          lVar16 = lVar16 + 1;
        } while (lVar16 != 8);
      }
      uVar15 = (ulong)paVar3->mNumFaces;
      if (uVar15 != 0) {
        puVar8 = (ulong *)operator_new__(uVar15 * 0x10 + 8);
        *puVar8 = uVar15;
        paVar9 = (aiFace *)(puVar8 + 1);
        paVar11 = paVar9;
        do {
          paVar11->mNumIndices = 0;
          paVar11->mIndices = (uint *)0x0;
          paVar11 = paVar11 + 1;
        } while (paVar11 != (aiFace *)(puVar8 + uVar15 * 2 + 1));
        paVar3->mFaces = paVar9;
        iVar10 = 0;
        cVar12._M_current = begin._M_current;
        do {
          paVar6 = *cVar12._M_current;
          if (paVar6->mNumFaces != 0) {
            uVar15 = 0;
            do {
              paVar1 = paVar6->mFaces;
              paVar11 = paVar1 + uVar15;
              paVar9->mNumIndices = paVar1[uVar15].mNumIndices;
              paVar9->mIndices = paVar1[uVar15].mIndices;
              if ((iVar10 != 0) && (paVar11->mNumIndices != 0)) {
                uVar14 = 0;
                do {
                  paVar11->mIndices[uVar14] = paVar11->mIndices[uVar14] + iVar10;
                  uVar14 = uVar14 + 1;
                } while (uVar14 < paVar11->mNumIndices);
              }
              paVar11->mIndices = (uint *)0x0;
              uVar15 = uVar15 + 1;
              paVar9 = paVar9 + 1;
              paVar6 = *cVar12._M_current;
            } while (uVar15 < paVar6->mNumFaces);
          }
          iVar10 = iVar10 + paVar6->mNumVertices;
          cVar12._M_current = cVar12._M_current + 1;
        } while (cVar12._M_current != end._M_current);
      }
      if (paVar3->mNumBones != 0) {
        MergeBones(paVar3,begin,end);
      }
      do {
        paVar3 = *begin._M_current;
        if (paVar3 != (aiMesh *)0x0) {
          aiMesh::~aiMesh(paVar3);
        }
        operator_delete(paVar3);
        begin._M_current = begin._M_current + 1;
      } while (begin._M_current != end._M_current);
      if (local_80 != local_70) {
        operator_delete(local_80);
      }
    }
  }
  return;
}

Assistant:

void SceneCombiner::MergeMeshes(aiMesh** _out, unsigned int /*flags*/,
    std::vector<aiMesh*>::const_iterator begin,
    std::vector<aiMesh*>::const_iterator end)
{
    if ( nullptr == _out ) {
        return;
    }

    if (begin == end)   {
        *_out = NULL; // no meshes ...
        return;
    }

    // Allocate the output mesh
    aiMesh* out = *_out = new aiMesh();
    out->mMaterialIndex = (*begin)->mMaterialIndex;

    std::string name;
    // Find out how much output storage we'll need
    for (std::vector<aiMesh*>::const_iterator it = begin; it != end; ++it) {
        const char *meshName( (*it)->mName.C_Str() );
        name += std::string( meshName );
        if ( it != end - 1 ) {
            name += ".";
        }
        out->mNumVertices   += (*it)->mNumVertices;
        out->mNumFaces      += (*it)->mNumFaces;
        out->mNumBones      += (*it)->mNumBones;

        // combine primitive type flags
        out->mPrimitiveTypes |= (*it)->mPrimitiveTypes;
    }
    out->mName.Set( name.c_str() );

    if (out->mNumVertices) {
        aiVector3D* pv2;

        // copy vertex positions
        if ((**begin).HasPositions())   {

            pv2 = out->mVertices = new aiVector3D[out->mNumVertices];
            for (std::vector<aiMesh*>::const_iterator it = begin; it != end; ++it)  {
                if ((*it)->mVertices)   {
                    ::memcpy(pv2,(*it)->mVertices,(*it)->mNumVertices*sizeof(aiVector3D));
                }
                else ASSIMP_LOG_WARN("JoinMeshes: Positions expected but input mesh contains no positions");
                pv2 += (*it)->mNumVertices;
            }
        }
        // copy normals
        if ((**begin).HasNormals()) {

            pv2 = out->mNormals = new aiVector3D[out->mNumVertices];
            for (std::vector<aiMesh*>::const_iterator it = begin; it != end;++it)   {
                if ((*it)->mNormals)    {
                    ::memcpy(pv2,(*it)->mNormals,(*it)->mNumVertices*sizeof(aiVector3D));
                } else {
                    ASSIMP_LOG_WARN( "JoinMeshes: Normals expected but input mesh contains no normals" );
                }
                pv2 += (*it)->mNumVertices;
            }
        }
        // copy tangents and bi-tangents
        if ((**begin).HasTangentsAndBitangents())   {

            pv2 = out->mTangents = new aiVector3D[out->mNumVertices];
            aiVector3D* pv2b = out->mBitangents = new aiVector3D[out->mNumVertices];

            for (std::vector<aiMesh*>::const_iterator it = begin; it != end;++it) {
                if ((*it)->mTangents)   {
                    ::memcpy(pv2, (*it)->mTangents,  (*it)->mNumVertices*sizeof(aiVector3D));
                    ::memcpy(pv2b,(*it)->mBitangents,(*it)->mNumVertices*sizeof(aiVector3D));
                } else {
                    ASSIMP_LOG_WARN( "JoinMeshes: Tangents expected but input mesh contains no tangents" );
                }
                pv2  += (*it)->mNumVertices;
                pv2b += (*it)->mNumVertices;
            }
        }
        // copy texture coordinates
        unsigned int n = 0;
        while ((**begin).HasTextureCoords(n)) {
            out->mNumUVComponents[n] = (*begin)->mNumUVComponents[n];

            pv2 = out->mTextureCoords[n] = new aiVector3D[out->mNumVertices];
            for (std::vector<aiMesh*>::const_iterator it = begin; it != end;++it)   {
                if ((*it)->mTextureCoords[n])   {
                    ::memcpy(pv2,(*it)->mTextureCoords[n],(*it)->mNumVertices*sizeof(aiVector3D));
                } else {
                    ASSIMP_LOG_WARN( "JoinMeshes: UVs expected but input mesh contains no UVs" );
                }
                pv2 += (*it)->mNumVertices;
            }
            ++n;
        }
        // copy vertex colors
        n = 0;
        while ((**begin).HasVertexColors(n))    {
            aiColor4D *pVec2 = out->mColors[n] = new aiColor4D[out->mNumVertices];
            for ( std::vector<aiMesh*>::const_iterator it = begin; it != end; ++it )   {
                if ((*it)->mColors[n])  {
                    ::memcpy( pVec2, (*it)->mColors[ n ], (*it)->mNumVertices * sizeof( aiColor4D ) ) ;
                } else {
                    ASSIMP_LOG_WARN( "JoinMeshes: VCs expected but input mesh contains no VCs" );
                }
                pVec2 += (*it)->mNumVertices;
            }
            ++n;
        }
    }

    if (out->mNumFaces) // just for safety
    {
        // copy faces
        out->mFaces = new aiFace[out->mNumFaces];
        aiFace* pf2 = out->mFaces;

        unsigned int ofs = 0;
        for (std::vector<aiMesh*>::const_iterator it = begin; it != end;++it)   {
            for (unsigned int m = 0; m < (*it)->mNumFaces;++m,++pf2)    {
                aiFace& face = (*it)->mFaces[m];
                pf2->mNumIndices = face.mNumIndices;
                pf2->mIndices = face.mIndices;

                if (ofs)    {
                    // add the offset to the vertex
                    for (unsigned int q = 0; q < face.mNumIndices; ++q)
                        face.mIndices[q] += ofs;
                }
                face.mIndices = NULL;
            }
            ofs += (*it)->mNumVertices;
        }
    }

    // bones - as this is quite lengthy, I moved the code to a separate function
    if (out->mNumBones)
        MergeBones(out,begin,end);

    // delete all source meshes
    for (std::vector<aiMesh*>::const_iterator it = begin; it != end;++it)
        delete *it;
}